

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSurfaceStyle::IfcSurfaceStyle(IfcSurfaceStyle *this)

{
  IfcSurfaceStyle *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x80,"IfcSurfaceStyle");
  IfcPresentationStyle::IfcPresentationStyle
            (&this->super_IfcPresentationStyle,&PTR_construction_vtable_24__00fa3968);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyle,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyle,_2UL> *)
             &(this->super_IfcPresentationStyle).field_0x38,&PTR_construction_vtable_24__00fa3988);
  (this->super_IfcPresentationStyle).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xfa3900;
  *(undefined8 *)&this->field_0x80 = 0xfa3950;
  *(undefined8 *)&(this->super_IfcPresentationStyle).field_0x38 = 0xfa3928;
  std::__cxx11::string::string((string *)&(this->super_IfcPresentationStyle).field_0x48);
  STEP::ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_5UL>::ListOf(&this->Styles);
  return;
}

Assistant:

IfcSurfaceStyle() : Object("IfcSurfaceStyle") {}